

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

const_iterator __thiscall
duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>::Scan
          (ModeState<duckdb::string_t,_duckdb::ModeString> *this)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  iterator i;
  iterator highest_frequency;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_const_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> local_28;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> local_20;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> local_18;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> local_8;
  
  local_20._M_cur =
       (__node_type *)
       OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_18._M_cur = local_20._M_cur;
  do {
    local_28._M_cur =
         (__node_type *)
         OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar2 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar2) {
      std::__detail::
      _Node_const_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
      _Node_const_iterator
                (in_stack_ffffffffffffffc0,
                 (_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true> *
                 )in_stack_ffffffffffffffb8);
      return (const_iterator)
             (_Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>)
             local_8._M_cur;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                         *)0xaf7b80);
    uVar1 = (ppVar3->second).count;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                         *)0xaf7b93);
    if ((ppVar3->second).count < uVar1) {
LAB_00af7bf5:
      local_18._M_cur = local_20._M_cur;
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                           *)0xaf7bab);
      in_stack_ffffffffffffffc0 =
           (_Node_const_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true> *
           )(ppVar3->second).count;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                           *)0xaf7bbe);
      if (in_stack_ffffffffffffffc0 ==
          (_Node_const_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true> *)
          (ppVar3->second).count) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                             *)0xaf7bd6);
        in_stack_ffffffffffffffb8 =
             (OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
              *)(ppVar3->second).first_row;
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                             *)0xaf7be8);
        if (in_stack_ffffffffffffffb8 <
            (OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
             *)(ppVar3->second).first_row) goto LAB_00af7bf5;
      }
    }
    std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true> *
                 )in_stack_ffffffffffffffc0);
  } while( true );
}

Assistant:

typename Counts::const_iterator Scan() const {
		//! Initialize control variables to first variable of the frequency map
		auto highest_frequency = frequency_map->begin();
		for (auto i = highest_frequency; i != frequency_map->end(); ++i) {
			// Tie break with the lowest insert position
			if (i->second.count > highest_frequency->second.count ||
			    (i->second.count == highest_frequency->second.count &&
			     i->second.first_row < highest_frequency->second.first_row)) {
				highest_frequency = i;
			}
		}
		return highest_frequency;
	}